

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

int __thiscall
dynamicgraph::SignalPtr<double,_int>::access(SignalPtr<double,_int> *this,char *__name,int __type)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  Signal<double,_int> *pSVar4;
  int __type_00;
  int *t_local;
  SignalPtr<double,_int> *this_local;
  
  if ((((this->modeNoThrow & 1U) != 0) && (uVar2 = (*this->_vptr_SignalPtr[4])(), (uVar2 & 1) == 0))
     && (((&this->field_0x50)[(long)this->_vptr_SignalPtr[-3]] & 1) != 0)) {
    pdVar3 = Signal<double,_int>::accessCopy
                       ((Signal<double,_int> *)
                        ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
    return (int)pdVar3;
  }
  bVar1 = autoref(this);
  if (bVar1) {
    this_local._0_4_ =
         Signal<double,_int>::access
                   ((Signal<double,_int> *)
                    ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]),__name,
                    __type_00);
  }
  else if ((this->transmitAbstract & 1U) == 0) {
    pSVar4 = getPtr(this);
    this_local._0_4_ = (*(pSVar4->super_SignalBase<int>)._vptr_SignalBase[0x1c])(pSVar4,__name);
  }
  else {
    (*this->abstractTransmitter->_vptr_SignalBase[0x13])(this->abstractTransmitter,__name);
    this_local._0_4_ = (int)this->transmitAbstractData;
  }
  return (int)this_local;
}

Assistant:

const T &SignalPtr<T, Time>::access(const Time &t) {
  dgTDEBUGIN(15);
  if (modeNoThrow && (!isPlugged()) && Signal<T, Time>::copyInit) {
    dgTDEBUGOUT(15);
    return Signal<T, Time>::accessCopy();
  } else if (autoref()) {
    dgTDEBUGOUT(15);
    return Signal<T, Time>::access(t);
  } else if (transmitAbstract) {
    abstractTransmitter->recompute(t);
    dgTDEBUGOUT(15);
    return *transmitAbstractData;
  } else {
    dgTDEBUGOUT(15);
    return getPtr()->access(t);
  }
}